

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cpp
# Opt level: O2

void __thiscall
Parser::printMsg(Parser *this,QByteArrayView formatStringSuffix,QByteArrayView msg,Symbol *sym)

{
  long lVar1;
  FILE *pFVar2;
  reference pQVar3;
  char *pcVar4;
  char *pcVar5;
  long in_FS_OFFSET;
  QStringBuilder<const_char_(&)[11],_QByteArrayView_&> local_78;
  QArrayDataPointer<char> local_68;
  QByteArrayView formatStringSuffix_local;
  
  formatStringSuffix_local.m_data = formatStringSuffix.m_data;
  formatStringSuffix_local.m_size = formatStringSuffix.m_size;
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  if (sym->lineNum == -1) {
    local_68.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
    local_68.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
    local_68.ptr = &DAT_aaaaaaaaaaaaaaaa;
    local_78.a = (char (*) [11])0x164652;
    local_78.b = &formatStringSuffix_local;
    QStringBuilder<const_char_(&)[5],_QByteArrayView_&>::convertTo<QByteArray>
              ((QByteArray *)&local_68,
               (QStringBuilder<const_char_(&)[5],_QByteArrayView_&> *)&local_78);
    pFVar2 = _stderr;
    pcVar5 = local_68.ptr;
    if (local_68.ptr == (char *)0x0) {
      pcVar5 = &QByteArray::_empty;
    }
    pQVar3 = std::stack<QByteArray,_QList<QByteArray>_>::top(&this->currentFilenames);
    pcVar4 = (pQVar3->d).ptr;
    if (pcVar4 == (char *)0x0) {
      pcVar4 = &QByteArray::_empty;
    }
    fprintf(pFVar2,pcVar5,pcVar4,msg.m_data);
  }
  else {
    local_68.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
    local_68.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
    local_68.ptr = &DAT_aaaaaaaaaaaaaaaa;
    local_78.a = (char (*) [11])0x1671f8;
    local_78.b = &formatStringSuffix_local;
    QStringBuilder<const_char_(&)[11],_QByteArrayView_&>::convertTo<QByteArray>
              ((QByteArray *)&local_68,&local_78);
    pFVar2 = _stderr;
    pcVar5 = local_68.ptr;
    if (local_68.ptr == (char *)0x0) {
      pcVar5 = &QByteArray::_empty;
    }
    pQVar3 = std::stack<QByteArray,_QList<QByteArray>_>::top(&this->currentFilenames);
    pcVar4 = (pQVar3->d).ptr;
    if (pcVar4 == (char *)0x0) {
      pcVar4 = &QByteArray::_empty;
    }
    fprintf(pFVar2,pcVar5,pcVar4,(ulong)(uint)sym->lineNum,1,msg.m_data);
  }
  QArrayDataPointer<char>::~QArrayDataPointer(&local_68);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void Parser::printMsg(QByteArrayView formatStringSuffix, QByteArrayView msg, const Symbol &sym)
{
    if (sym.lineNum != -1) {
#ifdef Q_CC_MSVC
        QByteArray formatString = "%s(%d:%d): " + formatStringSuffix;
#else
        QByteArray formatString = "%s:%d:%d: " + formatStringSuffix;
#endif
        fprintf(stderr, formatString.constData(),
                currentFilenames.top().constData(), sym.lineNum, 1, msg.data());
    } else {
        QByteArray formatString = "%s: " + formatStringSuffix;
        fprintf(stderr, formatString.constData(),
                currentFilenames.top().constData(), msg.data());
    }
}